

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderMoneyTest.cpp
# Opt level: O3

void __thiscall OrderMoneyTest::OrderMoneyTest(OrderMoneyTest *this)

{
  undefined1 local_1f1;
  shared_ptr<oout::NamedTest> local_1f0;
  shared_ptr<oout::NamedTest> local_1e0;
  shared_ptr<oout::NamedTest> local_1d0;
  shared_ptr<RealMoney> local_1c0;
  shared_ptr<RealMoney> local_1b0;
  shared_ptr<RealMoney> local_1a0;
  shared_ptr<RealMoney> local_190;
  shared_ptr<RealMoney> local_180;
  shared_ptr<Bank> local_170;
  shared_ptr<OrderMoney> local_160;
  shared_ptr<MoneyText> local_150;
  shared_ptr<oout::EqualTest> local_140;
  shared_ptr<RealMoney> local_130;
  shared_ptr<OrderMoney> local_120;
  shared_ptr<MoneyText> local_110;
  shared_ptr<oout::EqualTest> local_100;
  shared_ptr<RealMoney> local_f0;
  shared_ptr<OrderMoney> local_e0;
  shared_ptr<MoneyText> local_d0;
  shared_ptr<oout::EqualTest> local_c0;
  shared_ptr<RealMoney> local_b0;
  shared_ptr<OrderMoney> local_a0;
  shared_ptr<MoneyText> local_90;
  shared_ptr<oout::EqualTest> local_80;
  shared_ptr<oout::NamedTest> local_70;
  int local_5c [9];
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"OrderMoney tests","");
  local_5c[8] = 5;
  local_b0.super___shared_ptr<RealMoney,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<RealMoney,std::allocator<RealMoney>,int,char_const(&)[4]>
            (&local_b0.super___shared_ptr<RealMoney,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (RealMoney **)&local_b0,(allocator<RealMoney> *)&local_190,local_5c + 8,
             (char (*) [4])0x11a01a);
  local_5c[7] = 7;
  local_190.super___shared_ptr<RealMoney,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<RealMoney,std::allocator<RealMoney>,int,char_const(&)[4]>
            (&local_190.super___shared_ptr<RealMoney,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (RealMoney **)&local_190,(allocator<RealMoney> *)&local_1d0,local_5c + 7,
             (char (*) [4])0x11a01a);
  local_a0.super___shared_ptr<OrderMoney,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<OrderMoney,std::allocator<OrderMoney>,std::shared_ptr<RealMoney>,std::shared_ptr<RealMoney>>
            (&local_a0.super___shared_ptr<OrderMoney,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (OrderMoney **)&local_a0,(allocator<OrderMoney> *)&local_1d0,&local_b0,&local_190);
  local_90.super___shared_ptr<MoneyText,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<MoneyText,std::allocator<MoneyText>,std::shared_ptr<OrderMoney>>
            (&local_90.super___shared_ptr<MoneyText,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (MoneyText **)&local_90,(allocator<MoneyText> *)&local_1d0,&local_a0);
  local_80.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::EqualTest,std::allocator<oout::EqualTest>,std::shared_ptr<MoneyText>,char_const(&)[7]>
            (&local_80.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (EqualTest **)&local_80,(allocator<oout::EqualTest> *)&local_1d0,&local_90,
             (char (*) [7])"12 USD");
  local_70.super___shared_ptr<oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::NamedTest,std::allocator<oout::NamedTest>,char_const(&)[31],std::shared_ptr<oout::EqualTest>>
            (&local_70.super___shared_ptr<oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (NamedTest **)&local_70,(allocator<oout::NamedTest> *)&local_1d0,
             (char (*) [31])"OrderMoney is sum of all items",&local_80);
  local_5c[6] = 0x2a;
  local_f0.super___shared_ptr<RealMoney,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<RealMoney,std::allocator<RealMoney>,int,char_const(&)[4]>
            (&local_f0.super___shared_ptr<RealMoney,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (RealMoney **)&local_f0,(allocator<RealMoney> *)&local_1e0,local_5c + 6,
             (char (*) [4])0x11a01a);
  local_e0.super___shared_ptr<OrderMoney,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<OrderMoney,std::allocator<OrderMoney>,std::shared_ptr<RealMoney>>
            (&local_e0.super___shared_ptr<OrderMoney,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (OrderMoney **)&local_e0,(allocator<OrderMoney> *)&local_1e0,&local_f0);
  local_d0.super___shared_ptr<MoneyText,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<MoneyText,std::allocator<MoneyText>,std::shared_ptr<OrderMoney>>
            (&local_d0.super___shared_ptr<MoneyText,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (MoneyText **)&local_d0,(allocator<MoneyText> *)&local_1e0,&local_e0);
  local_c0.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::EqualTest,std::allocator<oout::EqualTest>,std::shared_ptr<MoneyText>,char_const(&)[7]>
            (&local_c0.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (EqualTest **)&local_c0,(allocator<oout::EqualTest> *)&local_1e0,&local_d0,
             (char (*) [7])"42 USD");
  local_1d0.super___shared_ptr<oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::NamedTest,std::allocator<oout::NamedTest>,char_const(&)[31],std::shared_ptr<oout::EqualTest>>
            (&local_1d0.super___shared_ptr<oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (NamedTest **)&local_1d0,(allocator<oout::NamedTest> *)&local_1e0,
             (char (*) [31])"OrderMoney is sum of one items",&local_c0);
  local_5c[5] = 1;
  local_130.super___shared_ptr<RealMoney,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<RealMoney,std::allocator<RealMoney>,int,char_const(&)[4]>
            (&local_130.super___shared_ptr<RealMoney,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (RealMoney **)&local_130,(allocator<RealMoney> *)&local_1a0,local_5c + 5,
             (char (*) [4])0x11a01a);
  local_5c[4] = 2;
  local_1a0.super___shared_ptr<RealMoney,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<RealMoney,std::allocator<RealMoney>,int,char_const(&)[4]>
            (&local_1a0.super___shared_ptr<RealMoney,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (RealMoney **)&local_1a0,(allocator<RealMoney> *)&local_1b0,local_5c + 4,
             (char (*) [4])0x11a01a);
  local_5c[3] = 4;
  local_1b0.super___shared_ptr<RealMoney,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<RealMoney,std::allocator<RealMoney>,int,char_const(&)[4]>
            (&local_1b0.super___shared_ptr<RealMoney,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (RealMoney **)&local_1b0,(allocator<RealMoney> *)&local_1f0,local_5c + 3,
             (char (*) [4])0x11a01a);
  local_120.super___shared_ptr<OrderMoney,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<OrderMoney,std::allocator<OrderMoney>,std::shared_ptr<RealMoney>,std::shared_ptr<RealMoney>,std::shared_ptr<RealMoney>>
            (&local_120.super___shared_ptr<OrderMoney,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (OrderMoney **)&local_120,(allocator<OrderMoney> *)&local_1f0,&local_130,&local_1a0,
             &local_1b0);
  local_110.super___shared_ptr<MoneyText,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<MoneyText,std::allocator<MoneyText>,std::shared_ptr<OrderMoney>>
            (&local_110.super___shared_ptr<MoneyText,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (MoneyText **)&local_110,(allocator<MoneyText> *)&local_1f0,&local_120);
  local_100.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::EqualTest,std::allocator<oout::EqualTest>,std::shared_ptr<MoneyText>,char_const(&)[6]>
            (&local_100.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (EqualTest **)&local_100,(allocator<oout::EqualTest> *)&local_1f0,&local_110,
             (char (*) [6])"7 USD");
  local_1e0.super___shared_ptr<oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::NamedTest,std::allocator<oout::NamedTest>,char_const(&)[33],std::shared_ptr<oout::EqualTest>>
            (&local_1e0.super___shared_ptr<oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (NamedTest **)&local_1e0,(allocator<oout::NamedTest> *)&local_1f0,
             (char (*) [33])"OrderMoney is sum of three items",&local_100);
  local_5c[2] = 2;
  local_170.super___shared_ptr<Bank,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Bank,std::allocator<Bank>,char_const(&)[4],char_const(&)[4],int>
            (&local_170.super___shared_ptr<Bank,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (Bank **)&local_170,(allocator<Bank> *)&local_1c0,(char (*) [4])"CHF",
             (char (*) [4])0x11a01a,local_5c + 2);
  local_5c[1] = 5;
  local_1c0.super___shared_ptr<RealMoney,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<RealMoney,std::allocator<RealMoney>,int,char_const(&)[4]>
            (&local_1c0.super___shared_ptr<RealMoney,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (RealMoney **)&local_1c0,(allocator<RealMoney> *)&local_180,local_5c + 1,
             (char (*) [4])0x11a01a);
  local_5c[0] = 10;
  local_180.super___shared_ptr<RealMoney,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<RealMoney,std::allocator<RealMoney>,int,char_const(&)[4]>
            (&local_180.super___shared_ptr<RealMoney,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (RealMoney **)&local_180,(allocator<RealMoney> *)&local_1f1,local_5c,
             (char (*) [4])"CHF");
  local_160.super___shared_ptr<OrderMoney,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<OrderMoney,std::allocator<OrderMoney>,char_const(&)[4],std::shared_ptr<Bank>,std::shared_ptr<RealMoney>,std::shared_ptr<RealMoney>>
            (&local_160.super___shared_ptr<OrderMoney,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (OrderMoney **)&local_160,(allocator<OrderMoney> *)&local_1f1,(char (*) [4])0x11a01a,
             &local_170,&local_1c0,&local_180);
  local_150.super___shared_ptr<MoneyText,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<MoneyText,std::allocator<MoneyText>,std::shared_ptr<OrderMoney>>
            (&local_150.super___shared_ptr<MoneyText,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (MoneyText **)&local_150,(allocator<MoneyText> *)&local_1f1,&local_160);
  local_140.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::EqualTest,std::allocator<oout::EqualTest>,std::shared_ptr<MoneyText>,char_const(&)[7]>
            (&local_140.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (EqualTest **)&local_140,(allocator<oout::EqualTest> *)&local_1f1,&local_150,
             (char (*) [7])"10 USD");
  local_1f0.super___shared_ptr<oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::NamedTest,std::allocator<oout::NamedTest>,char_const(&)[40],std::shared_ptr<oout::EqualTest>>
            (&local_1f0.super___shared_ptr<oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (NamedTest **)&local_1f0,(allocator<oout::NamedTest> *)&local_1f1,
             (char (*) [40])"OrderMoney is unify all money over Bank",&local_140);
  oout::dirty::Test::
  Test<std::shared_ptr<oout::NamedTest>,std::shared_ptr<oout::NamedTest>,std::shared_ptr<oout::NamedTest>,std::shared_ptr<oout::NamedTest>>
            (&this->super_Test,&local_38,&local_70,&local_1d0,&local_1e0,&local_1f0);
  if (local_1f0.super___shared_ptr<oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1f0.super___shared_ptr<oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if (local_140.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_140.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if (local_150.super___shared_ptr<MoneyText,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_150.super___shared_ptr<MoneyText,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  if (local_160.super___shared_ptr<OrderMoney,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_160.super___shared_ptr<OrderMoney,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_180.super___shared_ptr<RealMoney,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_180.super___shared_ptr<RealMoney,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  if (local_1c0.super___shared_ptr<RealMoney,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1c0.super___shared_ptr<RealMoney,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  if (local_170.super___shared_ptr<Bank,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.super___shared_ptr<Bank,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_1e0.super___shared_ptr<oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1e0.super___shared_ptr<oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if (local_100.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_100.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if (local_110.super___shared_ptr<MoneyText,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_110.super___shared_ptr<MoneyText,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  if (local_120.super___shared_ptr<OrderMoney,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_120.super___shared_ptr<OrderMoney,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_1b0.super___shared_ptr<RealMoney,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1b0.super___shared_ptr<RealMoney,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  if (local_1a0.super___shared_ptr<RealMoney,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1a0.super___shared_ptr<RealMoney,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  if (local_130.super___shared_ptr<RealMoney,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_130.super___shared_ptr<RealMoney,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  if (local_1d0.super___shared_ptr<oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1d0.super___shared_ptr<oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if (local_c0.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_d0.super___shared_ptr<MoneyText,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.super___shared_ptr<MoneyText,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  if (local_e0.super___shared_ptr<OrderMoney,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e0.super___shared_ptr<OrderMoney,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  if (local_f0.super___shared_ptr<RealMoney,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f0.super___shared_ptr<RealMoney,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  if (local_70.super___shared_ptr<oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.super___shared_ptr<oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_80.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_90.super___shared_ptr<MoneyText,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_90.super___shared_ptr<MoneyText,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  if (local_a0.super___shared_ptr<OrderMoney,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a0.super___shared_ptr<OrderMoney,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  if (local_190.super___shared_ptr<RealMoney,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_190.super___shared_ptr<RealMoney,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  if (local_b0.super___shared_ptr<RealMoney,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b0.super___shared_ptr<RealMoney,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  (this->super_Test).super_Test._vptr_Test = (_func_int **)&PTR__Test_00120330;
  return;
}

Assistant:

OrderMoneyTest::OrderMoneyTest()
: dirty::Test(
	"OrderMoney tests",
	make_shared<NamedTest>(
		"OrderMoney is sum of all items",
		make_shared<EqualTest>(
			make_shared<MoneyText>(
				make_shared<OrderMoney>(
					make_shared<RealMoney>(5, "USD"),
					make_shared<RealMoney>(7, "USD")
				)
			),
			"12 USD"
		)
	),
	make_shared<NamedTest>(
		"OrderMoney is sum of one items",
		make_shared<EqualTest>(
			make_shared<MoneyText>(
				make_shared<OrderMoney>(
					make_shared<RealMoney>(42, "USD")
				)
			),
			"42 USD"
		)
	),
	make_shared<NamedTest>(
		"OrderMoney is sum of three items",
		make_shared<EqualTest>(
			make_shared<MoneyText>(
				make_shared<OrderMoney>(
					make_shared<RealMoney>(1, "USD"),
					make_shared<RealMoney>(2, "USD"),
					make_shared<RealMoney>(4, "USD")
				)
			),
			"7 USD"
		)
	),
	make_shared<NamedTest>(
		"OrderMoney is unify all money over Bank",
		make_shared<EqualTest>(
			make_shared<MoneyText>(
				make_shared<OrderMoney>(
					"USD",
					make_shared<Bank>("CHF", "USD", 2),
					make_shared<RealMoney>(5, "USD"),
					make_shared<RealMoney>(10, "CHF")
				)
			),
			"10 USD"
		)
	)
)
{
}